

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBase.cpp
# Opt level: O3

void Diligent::ValidateTextureRegion(TextureDesc *TexDesc,Uint32 MipLevel,Uint32 Slice,Box *Box)

{
  Uint32 *Args_6;
  Uint32 *Args_4;
  Uint32 *Args_6_00;
  Uint32 *Args_4_00;
  byte bVar1;
  char *pcVar2;
  TextureFormatAttribs *pTVar3;
  ulong uVar4;
  Box *pBVar5;
  ulong uVar6;
  char (*Args_1) [61];
  uint uVar7;
  Uint32 *Args_6_01;
  Uint32 BlockAlignedMipWidth;
  Uint32 MipWidth;
  Uint32 Slice_local;
  Uint32 MipLevel_local;
  Uint32 BlockAlignedMipHeight;
  string msg;
  uint local_44;
  Uint32 *local_40;
  Uint32 *local_38;
  
  pBVar5 = Box;
  Slice_local = Slice;
  MipLevel_local = MipLevel;
  if (TexDesc->MipLevels <= MipLevel) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    MipWidth = TexDesc->MipLevels - 1;
    pBVar5 = (Box *)0x151;
    LogError<false,char[10],char_const*,char[4],char[12],unsigned_int,char[31],unsigned_int,char[2]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x151,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [12])"Mip level (",&MipLevel_local,
               (char (*) [31])") is out of allowed range [0, ",&MipWidth,(char (*) [2])0x33b93f);
  }
  Args_6 = &Box->MaxX;
  if (Box->MaxX <= Box->MinX) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    pBVar5 = (Box *)0x152;
    LogError<false,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x152,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [18])"Invalid X range: ",&Box->MinX,(char (*) [3])"..",Args_6);
  }
  Args_4 = &Box->MinY;
  Args_6_00 = &Box->MaxY;
  if (Box->MaxY <= Box->MinY) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    pBVar5 = (Box *)0x153;
    LogError<false,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x153,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [18])"Invalid Y range: ",Args_4,(char (*) [3])"..",Args_6_00);
  }
  Args_4_00 = &Box->MinZ;
  Args_6_01 = &Box->MaxZ;
  local_38 = Args_4;
  if (Box->MaxZ <= Box->MinZ) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    pBVar5 = (Box *)0x154;
    LogError<false,char[10],char_const*,char[4],char[18],unsigned_int,char[3],unsigned_int>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x154,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [18])"Invalid Z range: ",Args_4_00,(char (*) [3])"..",Args_6_01);
  }
  if ((TexDesc->Type < 9) && (pBVar5 = (Box *)0x1a8, (0x1a8U >> (TexDesc->Type & 0x1f) & 1) != 0)) {
    if ((TexDesc->field_3).ArraySize <= Slice_local) {
      pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar2 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar2;
      }
      MipWidth = (TexDesc->field_3).ArraySize - 1;
      pBVar5 = (Box *)0x158;
      LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[22],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x158,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [14])"Array slice (",&Slice_local,(char (*) [22])") is out of range [0,",
                 &MipWidth,(char (*) [3])0x3326d9);
    }
  }
  else if (Slice_local != 0) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    pBVar5 = (Box *)0x15c;
    LogError<false,char[10],char_const*,char[4],char[14],unsigned_int,char[36]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x15c,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [14])"Array slice (",&Slice_local,
               (char (*) [36])") must be 0 for non-array textures.");
  }
  pTVar3 = GetTextureFormatAttribs(TexDesc->Format);
  uVar6 = CONCAT71((int7)((ulong)pBVar5 >> 8),(byte)MipLevel_local);
  uVar7 = TexDesc->Width >> ((byte)MipLevel_local & 0x1f);
  MipWidth = uVar7 + (uVar7 == 0);
  if (pTVar3->ComponentType == COMPONENT_TYPE_COMPRESSED) {
    uVar4 = CONCAT71((int7)((ulong)pTVar3 >> 8),pTVar3->BlockWidth);
    uVar7 = (int)uVar4 - 1;
    if ((pTVar3->BlockWidth & (byte)uVar7) != 0) {
      FormatString<char[26],char[59]>
                (&msg,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"(FmtAttribs.BlockWidth & (FmtAttribs.BlockWidth - 1)) == 0",
                 (char (*) [59])(ulong)uVar7);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x164);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg._M_dataplus._M_p != &msg.field_2) {
        operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
      }
      uVar4 = (ulong)pTVar3->BlockWidth;
    }
    uVar4 = uVar4 & 0xff;
    BlockAlignedMipWidth = -(int)uVar4 & (MipWidth + (int)uVar4) - 1;
    local_40 = Args_6_01;
    if (BlockAlignedMipWidth < *Args_6) {
      pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar2 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar2;
      }
      LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x166,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [26])"Region max X coordinate (",Args_6,
                 (char (*) [31])") is out of allowed range [0, ",&BlockAlignedMipWidth,
                 (char (*) [3])0x3326d9);
      uVar4 = (ulong)pTVar3->BlockWidth;
    }
    if ((int)((ulong)Box->MinX % uVar4) != 0) {
      pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar2 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar2;
      }
      BlockAlignedMipHeight = (Uint32)uVar4;
      LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[38],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x167,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [54])"For compressed formats, the region min X coordinate (",&Box->MinX,
                 (char (*) [38])") must be a multiple of block width (",&BlockAlignedMipHeight,
                 (char (*) [3])0x366501);
      uVar4 = (ulong)pTVar3->BlockWidth;
    }
    uVar6 = (ulong)*Args_6;
    Args_6_01 = local_40;
    if (((int)(uVar6 % uVar4) != 0) && (*Args_6 != MipWidth)) {
      pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar2 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar2;
      }
      BlockAlignedMipHeight = (Uint32)uVar4;
      uVar6 = 0x168;
      LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[38],unsigned_int,char[33],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x168,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [54])"For compressed formats, the region max X coordinate (",Args_6,
                 (char (*) [38])") must be a multiple of block width (",&BlockAlignedMipHeight,
                 (char (*) [33])") or equal the mip level width (",&MipWidth,(char (*) [3])0x366501)
      ;
      Args_6_01 = local_40;
    }
  }
  else if (MipWidth < *Args_6) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    uVar6 = 0x16b;
    LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x16b,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [26])"Region max X coordinate (",Args_6,
               (char (*) [31])") is out of allowed range [0, ",&MipWidth,(char (*) [3])0x3326d9);
  }
  if ((TexDesc->Type & ~RESOURCE_DIM_BUFFER) != RESOURCE_DIM_TEX_1D) {
    uVar7 = TexDesc->Height >> ((byte)MipLevel_local & 0x1f);
    BlockAlignedMipWidth = uVar7 + (uVar7 == 0);
    if (pTVar3->ComponentType == COMPONENT_TYPE_COMPRESSED) {
      bVar1 = pTVar3->BlockHeight;
      Args_1 = (char (*) [61])CONCAT71((int7)(uVar6 >> 8),bVar1);
      if ((bVar1 & bVar1 - 1) != 0) {
        FormatString<char[26],char[61]>
                  (&msg,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"(FmtAttribs.BlockHeight & (FmtAttribs.BlockHeight - 1)) == 0",
                   Args_1);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x173);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg._M_dataplus._M_p != &msg.field_2) {
          operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
        }
        Args_1 = (char (*) [61])(ulong)pTVar3->BlockHeight;
      }
      uVar6 = (ulong)Args_1 & 0xff;
      BlockAlignedMipHeight = -(int)uVar6 & (BlockAlignedMipWidth + (int)uVar6) - 1;
      if (BlockAlignedMipHeight < *Args_6_00) {
        pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar2 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar2;
        }
        LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
                  (false,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x175,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [26])"Region max Y coordinate (",Args_6_00,
                   (char (*) [31])") is out of allowed range [0, ",&BlockAlignedMipHeight,
                   (char (*) [3])0x3326d9);
        uVar6 = (ulong)pTVar3->BlockHeight;
      }
      if ((int)((ulong)*local_38 % uVar6) != 0) {
        pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar2 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar2;
        }
        local_44 = (uint)uVar6;
        LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[3]>
                  (false,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x176,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [54])"For compressed formats, the region min Y coordinate (",local_38,
                   (char (*) [39])") must be a multiple of block height (",&local_44,
                   (char (*) [3])0x366501);
        uVar6 = (ulong)pTVar3->BlockHeight;
      }
      if (((int)((ulong)*Args_6_00 % uVar6) != 0) && (*Args_6_00 != BlockAlignedMipWidth)) {
        pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
        msg._M_dataplus._M_p = "";
        if (pcVar2 != (char *)0x0) {
          msg._M_dataplus._M_p = pcVar2;
        }
        local_44 = (uint)uVar6;
        LogError<false,char[10],char_const*,char[4],char[54],unsigned_int,char[39],unsigned_int,char[34],unsigned_int,char[3]>
                  (false,"ValidateTextureRegion",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                   ,0x177,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                   (char (*) [54])"For compressed formats, the region max Y coordinate (",Args_6_00,
                   (char (*) [39])") must be a multiple of block height (",&local_44,
                   (char (*) [34])") or equal the mip level height (",&BlockAlignedMipWidth,
                   (char (*) [3])0x366501);
      }
    }
    else if (BlockAlignedMipWidth < *Args_6_00) {
      pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar2 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar2;
      }
      LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[31],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x17a,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [26])"Region max Y coordinate (",Args_6_00,
                 (char (*) [31])") is out of allowed range [0, ",&BlockAlignedMipWidth,
                 (char (*) [3])0x3326d9);
    }
    if (TexDesc->Type == RESOURCE_DIM_TEX_3D) {
      uVar7 = (TexDesc->field_3).ArraySize >> ((byte)MipLevel_local & 0x1f);
      BlockAlignedMipWidth = uVar7 + (uVar7 == 0);
      if (*Args_6_01 <= BlockAlignedMipWidth) {
        return;
      }
      pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
      msg._M_dataplus._M_p = "";
      if (pcVar2 != (char *)0x0) {
        msg._M_dataplus._M_p = pcVar2;
      }
      LogError<false,char[10],char_const*,char[4],char[26],unsigned_int,char[32],unsigned_int,char[3]>
                (false,"ValidateTextureRegion",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
                 ,0x180,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
                 (char (*) [26])"Region max Z coordinate (",Args_6_01,
                 (char (*) [32])") is out of allowed range  [0, ",&BlockAlignedMipWidth,
                 (char (*) [3])0x3326d9);
      return;
    }
  }
  if (*Args_4_00 != 0) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    LogError<false,char[10],char_const*,char[4],char[15],unsigned_int,char[37]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x184,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [15])"Region min Z (",Args_4_00,
               (char (*) [37])") must be 0 for all but 3D textures.");
  }
  if (*Args_6_01 != 1) {
    pcVar2 = (TexDesc->super_DeviceObjectAttribs).Name;
    msg._M_dataplus._M_p = "";
    if (pcVar2 != (char *)0x0) {
      msg._M_dataplus._M_p = pcVar2;
    }
    LogError<false,char[10],char_const*,char[4],char[15],unsigned_int,char[37]>
              (false,"ValidateTextureRegion",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/TextureBase.cpp"
               ,0x185,(char (*) [10])0x35c58b,(char **)&msg,(char (*) [4])"\': ",
               (char (*) [15])"Region max Z (",Args_6_01,
               (char (*) [37])") must be 1 for all but 3D textures.");
  }
  return;
}

Assistant:

void ValidateTextureRegion(const TextureDesc& TexDesc, Uint32 MipLevel, Uint32 Slice, const Box& Box)
{
#define VERIFY_TEX_PARAMS(Expr, ...)                                                          \
    do                                                                                        \
    {                                                                                         \
        if (!(Expr))                                                                          \
        {                                                                                     \
            LOG_ERROR("Texture '", (TexDesc.Name ? TexDesc.Name : ""), "': ", ##__VA_ARGS__); \
        }                                                                                     \
    } while (false)

#ifdef DILIGENT_DEVELOPMENT
    VERIFY_TEX_PARAMS(MipLevel < TexDesc.MipLevels, "Mip level (", MipLevel, ") is out of allowed range [0, ", TexDesc.MipLevels - 1, "]");
    VERIFY_TEX_PARAMS(Box.MinX < Box.MaxX, "Invalid X range: ", Box.MinX, "..", Box.MaxX);
    VERIFY_TEX_PARAMS(Box.MinY < Box.MaxY, "Invalid Y range: ", Box.MinY, "..", Box.MaxY);
    VERIFY_TEX_PARAMS(Box.MinZ < Box.MaxZ, "Invalid Z range: ", Box.MinZ, "..", Box.MaxZ);

    if (TexDesc.IsArray())
    {
        VERIFY_TEX_PARAMS(Slice < TexDesc.ArraySize, "Array slice (", Slice, ") is out of range [0,", TexDesc.ArraySize - 1, "].");
    }
    else
    {
        VERIFY_TEX_PARAMS(Slice == 0, "Array slice (", Slice, ") must be 0 for non-array textures.");
    }

    const TextureFormatAttribs& FmtAttribs = GetTextureFormatAttribs(TexDesc.Format);

    Uint32 MipWidth = std::max(TexDesc.Width >> MipLevel, 1U);
    if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
    {
        VERIFY_EXPR((FmtAttribs.BlockWidth & (FmtAttribs.BlockWidth - 1)) == 0);
        Uint32 BlockAlignedMipWidth = (MipWidth + (FmtAttribs.BlockWidth - 1)) & ~(FmtAttribs.BlockWidth - 1);
        VERIFY_TEX_PARAMS(Box.MaxX <= BlockAlignedMipWidth, "Region max X coordinate (", Box.MaxX, ") is out of allowed range [0, ", BlockAlignedMipWidth, "].");
        VERIFY_TEX_PARAMS((Box.MinX % FmtAttribs.BlockWidth) == 0, "For compressed formats, the region min X coordinate (", Box.MinX, ") must be a multiple of block width (", Uint32{FmtAttribs.BlockWidth}, ").");
        VERIFY_TEX_PARAMS((Box.MaxX % FmtAttribs.BlockWidth) == 0 || Box.MaxX == MipWidth, "For compressed formats, the region max X coordinate (", Box.MaxX, ") must be a multiple of block width (", Uint32{FmtAttribs.BlockWidth}, ") or equal the mip level width (", MipWidth, ").");
    }
    else
        VERIFY_TEX_PARAMS(Box.MaxX <= MipWidth, "Region max X coordinate (", Box.MaxX, ") is out of allowed range [0, ", MipWidth, "].");

    if (TexDesc.Type != RESOURCE_DIM_TEX_1D &&
        TexDesc.Type != RESOURCE_DIM_TEX_1D_ARRAY)
    {
        Uint32 MipHeight = std::max(TexDesc.Height >> MipLevel, 1U);
        if (FmtAttribs.ComponentType == COMPONENT_TYPE_COMPRESSED)
        {
            VERIFY_EXPR((FmtAttribs.BlockHeight & (FmtAttribs.BlockHeight - 1)) == 0);
            Uint32 BlockAlignedMipHeight = (MipHeight + (FmtAttribs.BlockHeight - 1)) & ~(FmtAttribs.BlockHeight - 1);
            VERIFY_TEX_PARAMS(Box.MaxY <= BlockAlignedMipHeight, "Region max Y coordinate (", Box.MaxY, ") is out of allowed range [0, ", BlockAlignedMipHeight, "].");
            VERIFY_TEX_PARAMS((Box.MinY % FmtAttribs.BlockHeight) == 0, "For compressed formats, the region min Y coordinate (", Box.MinY, ") must be a multiple of block height (", Uint32{FmtAttribs.BlockHeight}, ").");
            VERIFY_TEX_PARAMS((Box.MaxY % FmtAttribs.BlockHeight) == 0 || Box.MaxY == MipHeight, "For compressed formats, the region max Y coordinate (", Box.MaxY, ") must be a multiple of block height (", Uint32{FmtAttribs.BlockHeight}, ") or equal the mip level height (", MipHeight, ").");
        }
        else
            VERIFY_TEX_PARAMS(Box.MaxY <= MipHeight, "Region max Y coordinate (", Box.MaxY, ") is out of allowed range [0, ", MipHeight, "].");
    }

    if (TexDesc.Type == RESOURCE_DIM_TEX_3D)
    {
        Uint32 MipDepth = std::max(TexDesc.Depth >> MipLevel, 1U);
        VERIFY_TEX_PARAMS(Box.MaxZ <= MipDepth, "Region max Z coordinate (", Box.MaxZ, ") is out of allowed range  [0, ", MipDepth, "].");
    }
    else
    {
        VERIFY_TEX_PARAMS(Box.MinZ == 0, "Region min Z (", Box.MinZ, ") must be 0 for all but 3D textures.");
        VERIFY_TEX_PARAMS(Box.MaxZ == 1, "Region max Z (", Box.MaxZ, ") must be 1 for all but 3D textures.");
    }
#endif
}